

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldd2bdd.c
# Opt level: O2

void run_WRAP(WorkerP *w,Task *__dq_head,TD_run *t)

{
  uint32_t uVar1;
  MDD arg_4;
  char *__s;
  undefined8 lddmc;
  FILE *pFVar2;
  size_t sVar3;
  ulong uVar4;
  size_t sVar5;
  void *__ptr;
  size_t sVar6;
  MDD MVar7;
  int *piVar8;
  set_t arg_1;
  MTBDD MVar9;
  set_t psVar10;
  int iVar11;
  uint32_t arg_3;
  int arg_3_00;
  uint32_t arg_3_01;
  int arg_3_02;
  uint32_t arg_3_03;
  int arg_3_04;
  undefined8 uVar12;
  uint uVar13;
  ulong uVar14;
  relation *__ptr_00;
  ulong uVar15;
  int iVar16;
  long lVar17;
  rel_t prVar18;
  bool bVar19;
  double dVar20;
  lddmc_satcount_double_t lVar21;
  int *piStack_d0;
  relation rStack_c8;
  MTBDD MStack_a0;
  set_t psStack_98;
  undefined1 auStack_90 [24];
  rel_t prStack_78;
  uint *puStack_70;
  char acStack_68 [24];
  set_t psStack_50;
  uint uStack_44;
  ulong uStack_40;
  int iStack_38;
  uint uStack_34;
  
  __ptr_00 = &rStack_c8;
  piStack_d0 = (int *)0x1037db;
  pFVar2 = fopen(model_filename,"rb");
  if (pFVar2 == (FILE *)0x0) {
    piStack_d0 = (int *)0x10430e;
    fprintf(_stderr,"Cannot open file \'%s\'!\n",model_filename);
    uVar12 = 0x220;
  }
  else {
    piStack_d0 = (int *)0x1037fc;
    sVar3 = fread(&vector_size,4,1,pFVar2);
    if (sVar3 == 1) {
      if (verbose == '\x01') {
        piStack_d0 = (int *)0x10381b;
        puts("Loading initial state.");
      }
      piStack_d0 = (int *)0x103823;
      psStack_50 = set_load_RUN((FILE *)pFVar2);
      piStack_d0 = (int *)0x10383c;
      sVar3 = fread(&next_count,4,1,pFVar2);
      if (sVar3 == 1) {
        piStack_d0 = (int *)0x103856;
        next = (rel_t *)malloc((long)next_count << 3);
        if (verbose == '\x01') {
          piStack_d0 = (int *)0x103872;
          puts("Loading transition relations.");
        }
        for (lVar17 = 0; uVar4 = (ulong)next_count, lVar17 < (long)uVar4; lVar17 = lVar17 + 1) {
          auStack_90._0_8_ = rel_load_proj_WRAP;
          auStack_90._8_8_ = (_Worker *)0x1;
          piStack_d0 = (int *)0x1038aa;
          auStack_90._16_8_ = pFVar2;
          lace_run_task((Task *)auStack_90);
          next[lVar17] = (rel_t)auStack_90._16_8_;
        }
        for (lVar17 = 0; lVar17 < (int)uVar4; lVar17 = lVar17 + 1) {
          prStack_78 = next[lVar17];
          auStack_90._0_8_ = rel_load_WRAP;
          auStack_90._8_8_ = (_Worker *)0x1;
          piStack_d0 = (int *)0x103900;
          auStack_90._16_8_ = pFVar2;
          lace_run_task((Task *)auStack_90);
          uVar4 = (ulong)(uint)next_count;
        }
        iStack_38 = 0;
        piStack_d0 = (int *)0x103920;
        sVar3 = fread(&iStack_38,4,1,pFVar2);
        if (sVar3 == 1) {
          if (iStack_38 == 0) {
            piStack_d0 = (int *)0x1043c8;
            fwrite("Input file missing reachable states!\n",0x25,1,_stderr);
            uVar12 = 0x235;
            __ptr_00 = &rStack_c8;
          }
          else {
            if (verbose == '\x01') {
              piStack_d0 = (int *)0x103949;
              puts("Loading reachable states.");
            }
            piStack_d0 = (int *)0x103951;
            psStack_98 = set_load_RUN((FILE *)pFVar2);
            uStack_34 = 0;
            piStack_d0 = (int *)0x10396d;
            sVar3 = fread(&uStack_34,4,1,pFVar2);
            if (sVar3 != 1) {
              uStack_34 = 0;
            }
            rStack_c8.meta = (MDD)&rStack_c8;
            lVar17 = -((ulong)uStack_34 * 8 + 0xf & 0xfffffffffffffff0);
            __ptr_00 = (relation *)((long)&rStack_c8 + lVar17);
            rStack_c8.w_proj = (int *)__ptr_00;
            uVar14 = 0;
            uVar4 = (ulong)uStack_34;
            if ((int)uStack_34 < 1) {
              uVar4 = uVar14;
            }
            *(undefined8 *)((long)&piStack_d0 + lVar17) = 1;
            sVar3 = *(size_t *)((long)&piStack_d0 + lVar17);
            uStack_40 = uVar4;
            for (; uStack_40 != uVar14; uVar14 = uVar14 + 1) {
              *(undefined8 *)((long)&piStack_d0 + lVar17) = 4;
              sVar5 = *(size_t *)((long)&piStack_d0 + lVar17);
              *(undefined8 *)((long)&piStack_d0 + lVar17) = 0x1039cd;
              sVar5 = fread(auStack_90,sVar5,sVar3,pFVar2);
              if (sVar5 != 1) {
                *(undefined8 *)((long)&piStack_d0 + lVar17) = 0x14;
                sVar3 = *(size_t *)((long)&piStack_d0 + lVar17);
                *(undefined8 *)((long)&piStack_d0 + lVar17) = 1;
                sVar5 = *(size_t *)((long)&piStack_d0 + lVar17);
                *(undefined8 *)((long)&piStack_d0 + lVar17) = 0x1042a4;
                fwrite("Invalid input file!\n",sVar3,sVar5,_stderr);
                uVar12 = 0x244;
                goto LAB_001042e0;
              }
              uVar4 = auStack_90._0_8_ & 0xffffffff;
              uVar13 = auStack_90._0_4_ + 1;
              *(undefined8 *)((long)&piStack_d0 + lVar17) = 0x1039ea;
              __ptr = malloc((ulong)uVar13);
              *(void **)(rStack_c8.w_proj + uVar14 * 2) = __ptr;
              *(undefined8 *)((long)&piStack_d0 + lVar17) = 0x103a0c;
              sVar3 = fread(__ptr,sVar3,uVar4,pFVar2);
              if (sVar3 != uVar4) {
                *(undefined8 *)((long)&piStack_d0 + lVar17) = 0x14;
                sVar3 = *(size_t *)((long)&piStack_d0 + lVar17);
                *(undefined8 *)((long)&piStack_d0 + lVar17) = 1;
                sVar5 = *(size_t *)((long)&piStack_d0 + lVar17);
                *(undefined8 *)((long)&piStack_d0 + lVar17) = 0x104277;
                fwrite("Invalid input file!\n",sVar3,sVar5,_stderr);
                uVar12 = 0x246;
                goto LAB_001042e0;
              }
              *(undefined1 *)((long)__ptr + uVar4) = 0;
              *(undefined8 *)((long)&piStack_d0 + lVar17) = 1;
              sVar3 = *(size_t *)((long)&piStack_d0 + lVar17);
            }
            *(undefined8 *)((long)&piStack_d0 + lVar17) = 0x103a31;
            fclose(pFVar2);
            uVar4 = 0;
            *(undefined8 *)((long)&piStack_d0 + lVar17) = 0x103a49;
            printf("Read file %s.\n");
            psVar10 = psStack_98;
            if (verbose != '\0') {
              *(undefined8 *)((long)&piStack_d0 + lVar17) = 0x103a77;
              printf("%d integers per state, %d transition groups\n",(ulong)(uint)vector_size,
                     (ulong)(uint)next_count);
              *(undefined8 *)((long)&piStack_d0 + lVar17) = 0x103a83;
              puts("LDD nodes:");
              MVar7 = psStack_50->dd;
              *(undefined8 *)((long)&piStack_d0 + lVar17) = 0x103a8f;
              lddmc_nodecount(MVar7);
              *(undefined8 *)((long)&piStack_d0 + lVar17) = 0x103aa0;
              printf("Initial states: %zu LDD nodes\n");
              for (uVar14 = 0; (long)uVar14 < (long)next_count; uVar14 = uVar14 + 1) {
                MVar7 = next[uVar14]->dd;
                *(undefined8 *)((long)&piStack_d0 + lVar17) = 0x103ac9;
                sVar6 = lddmc_nodecount(MVar7);
                *(undefined8 *)((long)&piStack_d0 + lVar17) = 0x103ad9;
                printf("Transition %d: %zu LDD nodes\n",uVar14 & 0xffffffff,sVar6);
              }
              if (verbose == '\x01') {
                *(undefined8 *)((long)&piStack_d0 + lVar17) = 0x103af3;
                puts("Preparing conversion to BDD...");
              }
            }
            prVar18 = (rel_t)((long)__ptr_00 -
                             ((ulong)(uint)vector_size * 4 + 0xf & 0xfffffffffffffff0));
            uVar14 = 0;
            if (0 < vector_size) {
              uVar14 = (ulong)(uint)vector_size;
            }
            for (; uVar14 != uVar4; uVar4 = uVar4 + 1) {
              *(undefined4 *)((long)&prVar18->dd + uVar4 * 4) = 0;
            }
            auStack_90._16_8_ = psVar10->dd;
            auStack_90._0_8_ = compute_highest_WRAP;
            auStack_90._8_8_ = (_Worker *)0x1;
            prStack_78 = prVar18;
            prVar18[-1].w_proj = (int *)0x103b53;
            lace_run_task((Task *)auStack_90);
            uStack_44 = 0;
            for (lVar17 = 0; lVar17 < next_count; lVar17 = lVar17 + 1) {
              auStack_90._16_8_ = next[lVar17]->dd;
              prStack_78 = (rel_t)next[lVar17]->meta;
              auStack_90._0_8_ = compute_highest_action_WRAP;
              auStack_90._8_8_ = (_Worker *)0x1;
              puStack_70 = &uStack_44;
              prVar18[-1].w_proj = (int *)0x103ba0;
              lace_run_task((Task *)auStack_90);
            }
            __ptr_00 = (relation *)
                       ((long)prVar18 - ((ulong)(uint)vector_size * 4 + 0xf & 0xfffffffffffffff0));
            uVar4 = 0;
            uVar14 = 0;
            if (0 < vector_size) {
              uVar14 = (ulong)(uint)vector_size;
            }
            *(undefined8 *)((long)__ptr_00 + -8) = 0xffffffffffffffff;
            uVar15 = *(ulong *)((long)__ptr_00 + -8);
            for (; uVar4 != uVar14; uVar4 = uVar4 + 1) {
              uVar13 = *(uint *)((long)&prVar18->dd + uVar4 * 4);
              iVar11 = 0;
              while (uVar13 != 0) {
                iVar11 = iVar11 + 1;
                *(int *)((long)__ptr_00 + uVar4 * 4) = iVar11;
                uVar13 = uVar13 >> 1;
                *(uint *)((long)&prVar18->dd + uVar4 * 4) = uVar13;
              }
              *(uint *)((long)__ptr_00 + uVar4 * 4) = iVar11 + (uint)(iVar11 == 0);
            }
            actionbits = 0;
            *(undefined8 *)((long)__ptr_00 + -8) = 1;
            uVar13 = uStack_44;
            uVar4 = *(ulong *)((long)__ptr_00 + -8);
            *(undefined8 *)((long)__ptr_00 + -8) = 1;
            MVar7 = *(MDD *)((long)__ptr_00 + -8);
            while (iVar11 = (int)uVar4, uVar13 != 0) {
              uVar13 = uVar13 >> 1;
              uStack_44 = uVar13;
              uVar4 = (ulong)(iVar11 + 1);
              actionbits = iVar11;
            }
            if ((iVar11 == 1) && ((has_actions & 1) != 0)) {
              actionbits = 1;
            }
            if (verbose != '\0') {
              *(undefined8 *)((long)__ptr_00 + -8) = 0x103c51;
              printf("Bits per level: ");
              for (lVar17 = 0; lVar17 < vector_size; lVar17 = lVar17 + 1) {
                if (lVar17 != 0) {
                  *(undefined8 *)((long)__ptr_00 + -8) = 0x103c7d;
                  printf(", ");
                }
                uVar13 = *(uint *)((long)__ptr_00 + lVar17 * 4);
                *(undefined8 *)((long)__ptr_00 + -8) = 0x103c8c;
                printf("%d",(ulong)uVar13);
              }
              *(undefined8 *)((long)__ptr_00 + -8) = 10;
              uVar12 = *(undefined8 *)((long)__ptr_00 + -8);
              *(undefined8 *)((long)__ptr_00 + -8) = 0x103c99;
              putchar((int)uVar12);
              *(undefined8 *)((long)__ptr_00 + -8) = 0x103cad;
              printf("Action bits: %d.\n");
              *(undefined8 *)((long)__ptr_00 + -8) = 0xffffffffffffffff;
              uVar15 = *(ulong *)((long)__ptr_00 + -8);
            }
            for (iVar11 = 0; iVar11 < vector_size; iVar11 = iVar11 + 1) {
              uVar1 = *(uint32_t *)((long)__ptr_00 + (long)(vector_size + (int)uVar15) * 4);
              *(undefined8 *)((long)__ptr_00 + -8) = 0x103cd1;
              MVar7 = lddmc_makenode(uVar1,MVar7,0);
              uVar15 = (ulong)((int)uVar15 - 1);
            }
            uStack_40 = MVar7;
            *(undefined8 *)((long)__ptr_00 + -8) = 0x103ce7;
            lddmc_ref(MVar7);
            uVar14 = 0;
            uVar4 = (ulong)(uint)vector_size;
            if (vector_size < 1) {
              uVar4 = uVar14;
            }
            iVar11 = 0;
            for (; uVar4 != uVar14; uVar14 = uVar14 + 1) {
              iVar11 = iVar11 + *(int *)((long)__ptr_00 + uVar14 * 4);
            }
            rStack_c8.r_k = 0;
            rStack_c8.w_k = -0x80000000;
            iVar16 = 0;
            if (0 < iVar11) {
              iVar16 = iVar11;
            }
            uVar1 = iVar11 * 2;
            while( true ) {
              uVar12 = rStack_c8._16_8_;
              uVar1 = uVar1 - 2;
              bVar19 = iVar16 == 0;
              iVar16 = iVar16 + -1;
              if (bVar19) break;
              *(undefined8 *)((long)__ptr_00 + -8) = 0x103d3b;
              rStack_c8._16_8_ = mtbdd_makenode(uVar1,0,uVar12);
            }
            *(undefined8 *)((long)__ptr_00 + -8) = 0x103d53;
            mtbdd_protect((MTBDD *)&rStack_c8.r_k);
            if (verbose != '\0') {
              *(undefined8 *)((long)__ptr_00 + -8) = 0x103d68;
              puts("Converting to BDD...");
            }
            *(undefined8 *)((long)__ptr_00 + -8) = 0x103d7b;
            pFVar2 = fopen(bdd_filename,"w");
            if (pFVar2 != (FILE *)0x0) {
              *(undefined8 *)((long)__ptr_00 + -8) = 4;
              sVar3 = *(size_t *)((long)__ptr_00 + -8);
              *(undefined8 *)((long)__ptr_00 + -8) = 1;
              sVar5 = *(size_t *)((long)__ptr_00 + -8);
              *(undefined8 *)((long)__ptr_00 + -8) = 0x103da3;
              fwrite(&vector_size,sVar3,sVar5,pFVar2);
              *(undefined8 *)((long)__ptr_00 + -8) = 0x103db8;
              fwrite(__ptr_00,sVar3,(long)vector_size,pFVar2);
              *(undefined8 *)((long)__ptr_00 + -8) = 0x103dcd;
              fwrite(&actionbits,sVar3,sVar5,pFVar2);
              uVar4 = uStack_40;
              psVar10 = psStack_50;
              MVar7 = psStack_50->dd;
              *(undefined8 *)((long)__ptr_00 + -8) = 0x103ddd;
              piVar8 = (int *)bdd_from_ldd_RUN(MVar7,uVar4,arg_3);
              rStack_c8.r_proj = piVar8;
              *(undefined8 *)((long)__ptr_00 + -8) = 0x103df5;
              dVar20 = mtbdd_satcount_RUN((MTBDD)piVar8,(long)iVar11);
              MVar7 = psVar10->dd;
              *(undefined8 *)((long)__ptr_00 + -8) = 0x103e1c;
              lVar21 = lddmc_satcount_cached_RUN(MVar7);
              if (((long)(dVar20 - 9.223372036854776e+18) & (long)dVar20 >> 0x3f | (long)dVar20) !=
                  ((long)lVar21 >> 0x3f & (long)(lVar21 - 9.223372036854776e+18) | (long)lVar21)) {
                *(undefined8 *)((long)__ptr_00 + -8) = 0x10442e;
                __assert_fail("(size_t)mtbdd_satcount(new_initial, totalbits) == (size_t)lddmc_satcount_cached(initial->dd)"
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/examples/ldd2bdd.c"
                              ,0x2a8,"void run_WORK(WorkerP *, Task *)");
              }
              *(undefined8 *)((long)__ptr_00 + -8) = 0x103e4c;
              mtbdd_refs_push((MTBDD)piVar8);
              auStack_90._0_4_ = 0xffffffff;
              *(undefined8 *)((long)__ptr_00 + -8) = 4;
              sVar3 = *(size_t *)((long)__ptr_00 + -8);
              *(undefined8 *)((long)__ptr_00 + -8) = 1;
              sVar5 = *(size_t *)((long)__ptr_00 + -8);
              *(undefined8 *)((long)__ptr_00 + -8) = 0x103e64;
              fwrite(auStack_90,sVar3,sVar5,pFVar2);
              *(undefined8 *)((long)__ptr_00 + -8) = 0x103e73;
              mtbdd_writer_tobinary_RUN((FILE *)pFVar2,(MTBDD *)&rStack_c8.r_proj,arg_3_00);
              uVar4 = uStack_40;
              psVar10 = psStack_98;
              MVar7 = psStack_98->dd;
              *(undefined8 *)((long)__ptr_00 + -8) = 0x103e86;
              arg_1 = (set_t)bdd_from_ldd_RUN(MVar7,uVar4,arg_3_01);
              rStack_c8.dd = (MDD)arg_1;
              *(undefined8 *)((long)__ptr_00 + -8) = 0x103e9b;
              dVar20 = mtbdd_satcount_RUN((MTBDD)arg_1,(long)iVar11);
              MVar7 = psVar10->dd;
              *(undefined8 *)((long)__ptr_00 + -8) = 0x103ec6;
              lVar21 = lddmc_satcount_cached_RUN(MVar7);
              if (((long)(dVar20 - 9.223372036854776e+18) & (long)dVar20 >> 0x3f | (long)dVar20) !=
                  ((long)lVar21 >> 0x3f & (long)(lVar21 - 9.223372036854776e+18) | (long)lVar21)) {
                *(code **)((long)__ptr_00 + -8) = main;
                __assert_fail("(size_t)mtbdd_satcount(new_states, totalbits) == (size_t)lddmc_satcount_cached(states->dd)"
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/examples/ldd2bdd.c"
                              ,0x2b2,"void run_WORK(WorkerP *, Task *)");
              }
              *(undefined8 *)((long)__ptr_00 + -8) = 0x103ef6;
              mtbdd_refs_push((MTBDD)arg_1);
              piVar8 = rStack_c8.r_proj;
              if (verbose == '\x01') {
                *(undefined8 *)((long)__ptr_00 + -8) = 0x103f0b;
                sVar6 = mtbdd_nodecount((MTBDD)piVar8);
                *(undefined8 *)((long)__ptr_00 + -8) = 0x103f1c;
                printf("Initial states: %zu BDD nodes\n",sVar6);
                *(undefined8 *)((long)__ptr_00 + -8) = 0x103f24;
                sVar6 = mtbdd_nodecount((MTBDD)arg_1);
                *(undefined8 *)((long)__ptr_00 + -8) = 0x103f35;
                printf("Reachable states: %zu BDD nodes\n",sVar6);
              }
              *(undefined8 *)((long)__ptr_00 + -8) = 4;
              sVar3 = *(size_t *)((long)__ptr_00 + -8);
              *(undefined8 *)((long)__ptr_00 + -8) = 1;
              sVar5 = *(size_t *)((long)__ptr_00 + -8);
              *(undefined8 *)((long)__ptr_00 + -8) = 0x103f51;
              fwrite(&next_count,sVar3,sVar5,pFVar2);
              for (lVar17 = 0; uVar4 = (ulong)next_count, lVar17 < (long)uVar4; lVar17 = lVar17 + 1)
              {
                prVar18 = next[lVar17];
                *(undefined8 *)((long)__ptr_00 + -8) = 0x103f7d;
                fwrite(&prVar18->r_k,sVar3,sVar5,pFVar2);
                prVar18 = next[lVar17];
                *(undefined8 *)((long)__ptr_00 + -8) = 0x103f9a;
                fwrite(&prVar18->w_k,sVar3,sVar5,pFVar2);
                piVar8 = next[lVar17]->r_proj;
                iVar11 = next[lVar17]->r_k;
                *(undefined8 *)((long)__ptr_00 + -8) = 0x103fb8;
                fwrite(piVar8,sVar3,(long)iVar11,pFVar2);
                piVar8 = next[lVar17]->w_proj;
                iVar11 = next[lVar17]->w_k;
                *(undefined8 *)((long)__ptr_00 + -8) = 0x103fd6;
                fwrite(piVar8,sVar3,(long)iVar11,pFVar2);
              }
              psStack_50 = arg_1;
              uVar15 = 0;
              uVar14 = uStack_40;
              do {
                if ((long)(int)uVar4 <= (long)uVar15) {
                  if (no_reachable != '\0') {
                    iStack_38 = 0;
                  }
                  *(undefined8 *)((long)__ptr_00 + -8) = 4;
                  sVar3 = *(size_t *)((long)__ptr_00 + -8);
                  *(undefined8 *)((long)__ptr_00 + -8) = 1;
                  sVar5 = *(size_t *)((long)__ptr_00 + -8);
                  *(undefined8 *)((long)__ptr_00 + -8) = 0x104183;
                  fwrite(&iStack_38,sVar3,sVar5,pFVar2);
                  if (iStack_38 != 0) {
                    auStack_90._0_4_ = 0xffffffff;
                    *(undefined8 *)((long)__ptr_00 + -8) = 4;
                    sVar3 = *(size_t *)((long)__ptr_00 + -8);
                    *(undefined8 *)((long)__ptr_00 + -8) = 1;
                    sVar5 = *(size_t *)((long)__ptr_00 + -8);
                    *(undefined8 *)((long)__ptr_00 + -8) = 0x1041a0;
                    fwrite(auStack_90,sVar3,sVar5,pFVar2);
                    *(undefined8 *)((long)__ptr_00 + -8) = 0x1041af;
                    mtbdd_writer_tobinary_RUN((FILE *)pFVar2,&rStack_c8.dd,arg_3_04);
                  }
                  *(undefined8 *)((long)__ptr_00 + -8) = 1;
                  sVar3 = *(size_t *)((long)__ptr_00 + -8);
                  *(undefined8 *)((long)__ptr_00 + -8) = 0x1041ba;
                  mtbdd_refs_pop(sVar3);
                  *(undefined8 *)((long)__ptr_00 + -8) = 4;
                  sVar5 = *(size_t *)((long)__ptr_00 + -8);
                  *(undefined8 *)((long)__ptr_00 + -8) = 0x1041cf;
                  fwrite(&uStack_34,sVar5,sVar3,pFVar2);
                  uVar14 = 0;
                  uVar4 = (ulong)uStack_34;
                  if ((int)uStack_34 < 1) {
                    uVar4 = uVar14;
                  }
                  for (; uVar4 != uVar14; uVar14 = uVar14 + 1) {
                    __s = *(char **)(rStack_c8.w_proj + uVar14 * 2);
                    *(undefined8 *)((long)__ptr_00 + -8) = 0x1041f4;
                    sVar5 = strlen(__s);
                    auStack_90._0_4_ = (int)sVar5;
                    *(undefined8 *)((long)__ptr_00 + -8) = 4;
                    sVar5 = *(size_t *)((long)__ptr_00 + -8);
                    *(undefined8 *)((long)__ptr_00 + -8) = 0x10420f;
                    fwrite(auStack_90,sVar5,sVar3,pFVar2);
                    uVar15 = auStack_90._0_8_ & 0xffffffff;
                    *(undefined8 *)((long)__ptr_00 + -8) = 0x104223;
                    fwrite(__s,sVar3,uVar15,pFVar2);
                  }
                  *(undefined8 *)((long)__ptr_00 + -8) = 0x104230;
                  fclose(pFVar2);
                  *(undefined8 *)((long)__ptr_00 + -8) = 0x104245;
                  printf("Written file %s.\n",bdd_filename);
                  return;
                }
                MVar7 = next[uVar15]->dd;
                arg_4 = next[uVar15]->meta;
                *(undefined8 *)((long)__ptr_00 + -8) = 0x104017;
                MVar9 = bdd_from_ldd_rel_RUN(MVar7,uVar14,0,arg_4);
                MStack_a0 = MVar9;
                *(undefined8 *)((long)__ptr_00 + -8) = 0x104026;
                mtbdd_refs_push(MVar9);
                *(undefined8 *)((long)__ptr_00 + -8) = 0x104031;
                mtbdd_writer_tobinary_RUN((FILE *)pFVar2,&MStack_a0,arg_3_02);
                MVar9 = MStack_a0;
                if (verbose == '\x01') {
                  *(undefined8 *)((long)__ptr_00 + -8) = 0x104046;
                  sVar6 = mtbdd_nodecount(MVar9);
                  *(undefined8 *)((long)__ptr_00 + -8) = 0x10405a;
                  printf("Transition %d: %zu BDD nodes\n",uVar15 & 0xffffffff,sVar6);
                }
                if (check_results == '\x01') {
                  MVar7 = next[uVar15]->meta;
                  *(undefined8 *)((long)__ptr_00 + -8) = 0x104080;
                  MVar9 = meta_to_bdd(MVar7,uVar14,0);
                  *(undefined8 *)((long)__ptr_00 + -8) = 0x10408b;
                  mtbdd_refs_push(MVar9);
                  auStack_90._0_8_ = sylvan_relnext_WRAP;
                  auStack_90._8_8_ = (_Worker *)0x1;
                  auStack_90._16_8_ = psStack_50;
                  prStack_78 = (rel_t)MStack_a0;
                  acStack_68[0] = '\0';
                  acStack_68[1] = '\0';
                  acStack_68[2] = '\0';
                  acStack_68[3] = '\0';
                  puStack_70 = (uint *)MVar9;
                  *(undefined8 *)((long)__ptr_00 + -8) = 0x1040cb;
                  lace_run_task((Task *)auStack_90);
                  uVar12 = auStack_90._16_8_;
                  *(undefined8 *)((long)__ptr_00 + -8) = 0x1040d7;
                  mtbdd_refs_push(uVar12);
                  auStack_90._16_8_ = psStack_98->dd;
                  prStack_78 = (rel_t)next[uVar15]->dd;
                  puStack_70 = (uint *)next[uVar15]->meta;
                  auStack_90._0_8_ = lddmc_relprod_WRAP;
                  auStack_90._8_8_ = (_Worker *)0x1;
                  *(undefined8 *)((long)__ptr_00 + -8) = 0x104117;
                  lace_run_task((Task *)auStack_90);
                  lddmc = auStack_90._16_8_;
                  *(undefined8 *)((long)__ptr_00 + -8) = 0x104123;
                  lddmc_refs_push(lddmc);
                  uVar14 = uStack_40;
                  *(undefined8 *)((long)__ptr_00 + -8) = 0x104132;
                  psVar10 = (set_t)bdd_from_ldd_RUN(lddmc,uVar14,arg_3_03);
                  if ((set_t)uVar12 != psVar10) {
                    *(undefined8 *)((long)__ptr_00 + -8) = 0x12;
                    sVar3 = *(size_t *)((long)__ptr_00 + -8);
                    *(undefined8 *)((long)__ptr_00 + -8) = 1;
                    sVar5 = *(size_t *)((long)__ptr_00 + -8);
                    *(undefined8 *)((long)__ptr_00 + -8) = 0x1042d1;
                    fwrite("Conversion error!\n",sVar3,sVar5,_stderr);
                    uVar12 = 0x2db;
                    goto LAB_001042e0;
                  }
                  *(undefined8 *)((long)__ptr_00 + -8) = 1;
                  lVar17 = *(long *)((long)__ptr_00 + -8);
                  *(undefined8 *)((long)__ptr_00 + -8) = 0x104143;
                  lddmc_refs_pop(lVar17);
                  *(undefined8 *)((long)__ptr_00 + -8) = 2;
                  lVar17 = *(long *)((long)__ptr_00 + -8);
                  *(undefined8 *)((long)__ptr_00 + -8) = 0x10414b;
                  mtbdd_refs_pop(lVar17);
                }
                *(undefined8 *)((long)__ptr_00 + -8) = 1;
                lVar17 = *(long *)((long)__ptr_00 + -8);
                *(undefined8 *)((long)__ptr_00 + -8) = 0x104153;
                mtbdd_refs_pop(lVar17);
                uVar15 = uVar15 + 1;
                uVar4 = (ulong)(uint)next_count;
              } while( true );
            }
            *(undefined8 *)((long)__ptr_00 + -8) = 0x1043fb;
            fprintf(_stderr,"Cannot open file \'%s\'!\n",bdd_filename);
            uVar12 = 0x29f;
          }
        }
        else {
          piStack_d0 = (int *)0x104398;
          fwrite("Input file missing reachable states!\n",0x25,1,_stderr);
          uVar12 = 0x234;
          __ptr_00 = &rStack_c8;
        }
      }
      else {
        piStack_d0 = (int *)0x104368;
        fwrite("Invalid input file!\n",0x14,1,_stderr);
        uVar12 = 0x22a;
        __ptr_00 = &rStack_c8;
      }
    }
    else {
      piStack_d0 = (int *)0x10433b;
      fwrite("Invalid input file!\n",0x14,1,_stderr);
      uVar12 = 0x223;
      __ptr_00 = &rStack_c8;
    }
  }
LAB_001042e0:
  *(int *)((long)__ptr_00 + -8) = 0x1042e7;
  *(int *)((long)__ptr_00 + -4) = 0;
  fprintf(_stderr,"Abort at line %d!\n",uVar12);
  *(int *)((long)__ptr_00 + -8) = -1;
  *(int *)((long)__ptr_00 + -4) = -1;
  uVar12 = *(undefined8 *)((long)__ptr_00 + -8);
  *(int *)((long)__ptr_00 + -8) = 0x1042ef;
  *(int *)((long)__ptr_00 + -4) = 0;
  exit((int)uVar12);
}

Assistant:

VOID_TASK_0(run)
{
    // Open file
    FILE *f = fopen(model_filename, "rb");
    if (f == NULL) Abort("Cannot open file '%s'!\n", model_filename);

    // Read integers per vector
    if (fread(&vector_size, sizeof(int), 1, f) != 1) Abort("Invalid input file!\n");

    // Read initial state
    if (verbose) printf("Loading initial state.\n");
    set_t initial = set_load(f);

    // Read number of transitions
    if (fread(&next_count, sizeof(int), 1, f) != 1) Abort("Invalid input file!\n");
    next = (rel_t*)malloc(sizeof(rel_t) * next_count);

    // Read transitions
    if (verbose) printf("Loading transition relations.\n");
    for (int i=0; i<next_count; i++) next[i] = rel_load_proj(f);
    for (int i=0; i<next_count; i++) rel_load(f, next[i]);

    // Read whether reachable states are stored
    int has_reachable = 0;
    if (fread(&has_reachable, sizeof(int), 1, f) != 1) Abort("Input file missing reachable states!\n");
    if (has_reachable == 0) Abort("Input file missing reachable states!\n");

    // Read reachable states
    if (verbose) printf("Loading reachable states.\n");
    set_t states = set_load(f);
    
    // Read number of action labels
    int action_labels_count = 0;
    if (fread(&action_labels_count, sizeof(int), 1, f) != 1) action_labels_count = 0;
    // ignore: Abort("Input file missing action label count!\n");

    // Read action labels
    char *action_labels[action_labels_count];
    for (int i=0; i<action_labels_count; i++) {
        uint32_t len;
        if (fread(&len, sizeof(uint32_t), 1, f) != 1) Abort("Invalid input file!\n");
        action_labels[i] = (char*)malloc(sizeof(char[len+1]));
        if (fread(action_labels[i], sizeof(char), len, f) != len) Abort("Invalid input file!\n");
        action_labels[i][len] = 0;
    }

    // Close file
    fclose(f);

    // Report that we have read the input file
    printf("Read file %s.\n", model_filename);

    // Report statistics
    if (verbose) {
        printf("%d integers per state, %d transition groups\n", vector_size, next_count);
        printf("LDD nodes:\n");
        printf("Initial states: %zu LDD nodes\n", lddmc_nodecount(initial->dd));
        for (int i=0; i<next_count; i++) {
            printf("Transition %d: %zu LDD nodes\n", i, lddmc_nodecount(next[i]->dd));
        }
    }

    // Report that we prepare BDD conversion
    if (verbose) printf("Preparing conversion to BDD...\n");

    // Compute highest value at each level (from reachable states)
    uint32_t highest[vector_size];
    for (int i=0; i<vector_size; i++) highest[i] = 0;
    compute_highest(states->dd, highest);

    // Compute highest action label value (from transition relations)
    uint32_t highest_action = 0;
    for (int i=0; i<next_count; i++) {
        compute_highest_action(next[i]->dd, next[i]->meta, &highest_action);
    }

    // Compute number of bits for each level
    int bits[vector_size];
    for (int i=0; i<vector_size; i++) {
        bits[i] = 0;
        while (highest[i] != 0) {
            bits[i]++;
            highest[i]>>=1;
        }
        if (bits[i] == 0) bits[i] = 1;
    }

    // Compute number of bits for action label
    actionbits = 0;
    while (highest_action != 0) {
        actionbits++;
        highest_action>>=1;
    }
    if (actionbits == 0 && has_actions) actionbits = 1;

    // Report number of bits
    if (verbose) {
        printf("Bits per level: ");
        for (int i=0; i<vector_size; i++) {
            if (i>0) printf(", ");
            printf("%d", bits[i]);
        }
        printf("\n");
        printf("Action bits: %d.\n", actionbits);
    }

    // Compute bits MDD
    MDD bits_dd = lddmc_true;
    for (int i=0; i<vector_size; i++) {
        bits_dd = lddmc_makenode(bits[vector_size-i-1], bits_dd, lddmc_false);
    }
    lddmc_ref(bits_dd);

    // Compute total number of bits
    int totalbits = 0;
    for (int i=0; i<vector_size; i++) {
        totalbits += bits[i];
    }

    // Compute state variables
    MTBDD state_vars = mtbdd_true;
    for (int i=0; i<totalbits; i++) {
        state_vars = mtbdd_makenode(2*(totalbits-i-1), mtbdd_false, state_vars);
    }
    mtbdd_protect(&state_vars);

    // Report that we begin the actual conversion
    if (verbose) printf("Converting to BDD...\n");

    // Create BDD file
    f = fopen(bdd_filename, "w");
    if (f == NULL) Abort("Cannot open file '%s'!\n", bdd_filename);

    // Write domain...
    fwrite(&vector_size, sizeof(int), 1, f);
    fwrite(bits, sizeof(int), vector_size, f);
    fwrite(&actionbits, sizeof(int), 1, f);

    // Write initial state...
    MTBDD new_initial = bdd_from_ldd(initial->dd, bits_dd, 0);
    assert((size_t)mtbdd_satcount(new_initial, totalbits) == (size_t)lddmc_satcount_cached(initial->dd));
    mtbdd_refs_push(new_initial);
    {
        int k = -1;
        fwrite(&k, sizeof(int), 1, f);
        mtbdd_writer_tobinary(f, &new_initial, 1);
    }

    // Custom operation that converts to BDD given number of bits for each level
    MTBDD new_states = bdd_from_ldd(states->dd, bits_dd, 0);
    assert((size_t)mtbdd_satcount(new_states, totalbits) == (size_t)lddmc_satcount_cached(states->dd));
    mtbdd_refs_push(new_states);

    // Report size of BDD
    if (verbose) {
        printf("Initial states: %zu BDD nodes\n", mtbdd_nodecount(new_initial));
        printf("Reachable states: %zu BDD nodes\n", mtbdd_nodecount(new_states));
    }

    // Write number of transitions
    fwrite(&next_count, sizeof(int), 1, f);

    // Write meta for each transition
    for (int i=0; i<next_count; i++) {
        fwrite(&next[i]->r_k, sizeof(int), 1, f);
        fwrite(&next[i]->w_k, sizeof(int), 1, f);
        fwrite(next[i]->r_proj, sizeof(int), next[i]->r_k, f);
        fwrite(next[i]->w_proj, sizeof(int), next[i]->w_k, f);
    }

    // Write BDD for each transition
    for (int i=0; i<next_count; i++) {
        // Compute new transition relation
        MTBDD new_rel = bdd_from_ldd_rel(next[i]->dd, bits_dd, 0, next[i]->meta);
        mtbdd_refs_push(new_rel);
        mtbdd_writer_tobinary(f, &new_rel, 1);

        // Report number of nodes
        if (verbose) printf("Transition %d: %zu BDD nodes\n", i, mtbdd_nodecount(new_rel));

        if (check_results) {
            // Compute new <variables> for the current transition relation
            MTBDD new_vars = meta_to_bdd(next[i]->meta, bits_dd, 0);
            mtbdd_refs_push(new_vars);

            // Test if the transition is correctly converted
            MTBDD test = sylvan_relnext(new_states, new_rel, new_vars);
            mtbdd_refs_push(test);
            MDD succ = lddmc_relprod(states->dd, next[i]->dd, next[i]->meta);
            lddmc_refs_push(succ);
            MTBDD test2 = bdd_from_ldd(succ, bits_dd, 0);
            if (test != test2) Abort("Conversion error!\n");
            lddmc_refs_pop(1);
            mtbdd_refs_pop(2);
        }

        mtbdd_refs_pop(1);
    }

    // Write reachable states
    if (no_reachable) has_reachable = 0;
    fwrite(&has_reachable, sizeof(int), 1, f);
    if (has_reachable) {
        int k = -1;
        fwrite(&k, sizeof(int), 1, f);
        mtbdd_writer_tobinary(f, &new_states, 1);
    }
    mtbdd_refs_pop(1);  // new_states

    // Write action labels
    fwrite(&action_labels_count, sizeof(int), 1, f);
    for (int i=0; i<action_labels_count; i++) {
        uint32_t len = strlen(action_labels[i]);
        fwrite(&len, sizeof(uint32_t), 1, f);
        fwrite(action_labels[i], sizeof(char), len, f);
    }

    // Close the file
    fclose(f);

    // Report to the user
    printf("Written file %s.\n", bdd_filename);
}